

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glu.cpp
# Opt level: O3

int __thiscall ncnn::GLU::forward(GLU *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  void *pvVar12;
  ulong uVar13;
  uint uVar14;
  void *pvVar15;
  float fVar16;
  void *local_68;
  void *local_60;
  void *local_58;
  
  uVar5 = bottom_blob->dims;
  if (uVar5 == 1) {
    iVar3 = bottom_blob->w;
    uVar5 = iVar3 / 2;
    Mat::create(top_blob,uVar5,4,opt->blob_allocator);
    if (1 < iVar3) {
      pvVar15 = bottom_blob->data;
      pvVar12 = top_blob->data;
      uVar7 = 0;
      do {
        fVar16 = expf(-*(float *)((long)pvVar15 + uVar7 * 4 + (ulong)uVar5 * 4));
        *(float *)((long)pvVar12 + uVar7 * 4) =
             *(float *)((long)pvVar15 + uVar7 * 4) / (fVar16 + 1.0);
        uVar7 = uVar7 + 1;
      } while (uVar5 != uVar7);
      return 0;
    }
  }
  else {
    iVar3 = (this->axis >> 0x1f & uVar5) + this->axis;
    if ((uVar5 == 2) && (iVar3 == 0)) {
      iVar3 = bottom_blob->w;
      iVar6 = bottom_blob->h / 2;
      Mat::create(top_blob,iVar3,iVar6,4,opt->blob_allocator);
      uVar5 = iVar6 * iVar3;
      if (0 < (int)uVar5) {
        pvVar15 = bottom_blob->data;
        pvVar12 = top_blob->data;
        uVar7 = 0;
        do {
          fVar16 = expf(-*(float *)((long)pvVar15 + uVar7 * 4 + (ulong)uVar5 * 4));
          *(float *)((long)pvVar12 + uVar7 * 4) =
               *(float *)((long)pvVar15 + uVar7 * 4) / (fVar16 + 1.0);
          uVar7 = uVar7 + 1;
        } while (uVar5 != uVar7);
        return 0;
      }
    }
    else if ((uVar5 == 2) && (iVar3 == 1)) {
      iVar3 = bottom_blob->w;
      iVar6 = bottom_blob->h;
      uVar5 = iVar3 / 2;
      Mat::create(top_blob,uVar5,iVar6,4,opt->blob_allocator);
      if (0 < (long)iVar6) {
        pvVar12 = bottom_blob->data;
        pvVar11 = top_blob->data;
        iVar10 = top_blob->w;
        lVar4 = (long)bottom_blob->w * bottom_blob->elemsize;
        sVar1 = top_blob->elemsize;
        pvVar15 = (void *)((long)pvVar12 + (ulong)uVar5 * 4);
        lVar8 = 0;
        do {
          if (1 < iVar3) {
            uVar7 = 0;
            do {
              fVar16 = expf(-*(float *)((long)pvVar15 + uVar7 * 4));
              *(float *)((long)pvVar11 + uVar7 * 4) =
                   *(float *)((long)pvVar12 + uVar7 * 4) / (fVar16 + 1.0);
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
          lVar8 = lVar8 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar4);
          pvVar11 = (void *)((long)pvVar11 + (long)iVar10 * sVar1);
          pvVar12 = (void *)((long)pvVar12 + lVar4);
        } while (lVar8 != iVar6);
      }
    }
    else if ((uVar5 == 3) && (iVar3 == 0)) {
      iVar3 = bottom_blob->w;
      iVar6 = bottom_blob->h;
      iVar10 = bottom_blob->c;
      uVar5 = iVar10 / 2;
      Mat::create(top_blob,iVar3,iVar6,uVar5,4,opt->blob_allocator);
      if (1 < iVar10) {
        uVar14 = iVar6 * iVar3;
        pvVar12 = bottom_blob->data;
        pvVar11 = top_blob->data;
        sVar1 = top_blob->cstep;
        lVar4 = bottom_blob->cstep * bottom_blob->elemsize;
        sVar2 = top_blob->elemsize;
        pvVar15 = (void *)((long)pvVar12 + (long)(int)((int)bottom_blob->cstep * uVar5) * 4);
        uVar7 = 0;
        do {
          if (0 < (int)uVar14) {
            uVar13 = 0;
            do {
              fVar16 = expf(-*(float *)((long)pvVar15 + uVar13 * 4));
              *(float *)((long)pvVar11 + uVar13 * 4) =
                   *(float *)((long)pvVar12 + uVar13 * 4) / (fVar16 + 1.0);
              uVar13 = uVar13 + 1;
            } while (uVar14 != uVar13);
          }
          uVar7 = uVar7 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar4);
          pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
          pvVar12 = (void *)((long)pvVar12 + lVar4);
        } while (uVar7 != uVar5);
      }
    }
    else if ((uVar5 == 3) && (iVar3 == 1)) {
      iVar3 = bottom_blob->w;
      iVar6 = bottom_blob->c;
      iVar10 = bottom_blob->h / 2;
      Mat::create(top_blob,iVar3,iVar10,iVar6,4,opt->blob_allocator);
      if (0 < (long)iVar6) {
        uVar5 = iVar10 * iVar3;
        pvVar12 = bottom_blob->data;
        pvVar11 = top_blob->data;
        sVar1 = top_blob->cstep;
        lVar4 = bottom_blob->cstep * bottom_blob->elemsize;
        sVar2 = top_blob->elemsize;
        pvVar15 = (void *)((long)pvVar12 + (ulong)uVar5 * 4);
        lVar8 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar7 = 0;
            do {
              fVar16 = expf(-*(float *)((long)pvVar15 + uVar7 * 4));
              *(float *)((long)pvVar11 + uVar7 * 4) =
                   *(float *)((long)pvVar12 + uVar7 * 4) / (fVar16 + 1.0);
              uVar7 = uVar7 + 1;
            } while (uVar5 != uVar7);
          }
          lVar8 = lVar8 + 1;
          pvVar15 = (void *)((long)pvVar15 + lVar4);
          pvVar11 = (void *)((long)pvVar11 + sVar1 * sVar2);
          pvVar12 = (void *)((long)pvVar12 + lVar4);
        } while (lVar8 != iVar6);
        return 0;
      }
    }
    else {
      if (uVar5 != 3) {
        return -100;
      }
      if (iVar3 != 2) {
        return -100;
      }
      iVar3 = bottom_blob->w;
      iVar6 = bottom_blob->h;
      iVar10 = bottom_blob->c;
      uVar5 = iVar3 / 2;
      Mat::create(top_blob,uVar5,iVar6,iVar10,4,opt->blob_allocator);
      if (0 < (long)iVar10) {
        local_58 = bottom_blob->data;
        local_60 = top_blob->data;
        sVar1 = top_blob->cstep;
        lVar4 = bottom_blob->cstep * bottom_blob->elemsize;
        local_68 = (void *)((long)local_58 + (ulong)uVar5 * 4);
        sVar2 = top_blob->elemsize;
        lVar8 = 0;
        do {
          if (0 < iVar6) {
            iVar9 = 0;
            pvVar15 = local_60;
            pvVar12 = local_58;
            pvVar11 = local_68;
            do {
              if (1 < iVar3) {
                uVar7 = 0;
                do {
                  fVar16 = expf(-*(float *)((long)pvVar11 + uVar7 * 4));
                  *(float *)((long)pvVar15 + uVar7 * 4) =
                       *(float *)((long)pvVar12 + uVar7 * 4) / (fVar16 + 1.0);
                  uVar7 = uVar7 + 1;
                } while (uVar5 != uVar7);
              }
              iVar9 = iVar9 + 1;
              pvVar11 = (void *)((long)pvVar11 + (long)iVar3 * 4);
              pvVar15 = (void *)((long)pvVar15 + (long)(int)uVar5 * 4);
              pvVar12 = (void *)((long)pvVar12 + (long)iVar3 * 4);
            } while (iVar9 != iVar6);
          }
          lVar8 = lVar8 + 1;
          local_68 = (void *)((long)local_68 + lVar4);
          local_60 = (void *)((long)local_60 + sVar1 * sVar2);
          local_58 = (void *)((long)local_58 + lVar4);
        } while (lVar8 != iVar10);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int GLU::forward(const Mat& bottom_blob, Mat& top_blob,
                 const Option& opt) const
{
    int dims = bottom_blob.dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1)
    {   // ignore axis
        int w = bottom_blob.w;
        int out_w = w / 2;
        top_blob.create(out_w, sizeof(float), opt.blob_allocator);

        const float* in_ptr = bottom_blob;
        float* out_ptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int x = 0; x < out_w; ++x)
        {
            float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));

            out_ptr[x] = in_ptr[x] * sigmoid;
        }

        return 0;
    } // if (dims == 1)

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int out_w = w;
        int out_h = h / 2;
        top_blob.create(out_w, out_h, sizeof(float), opt.blob_allocator);

        int offset = out_w * out_h;

#if 0
        // this one is equivalent to the else branch. It is more readable
        // but less efficient
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < out_h; ++y) {
            const float *in_ptr = bottom_blob.row(y);
            float *out_ptr = top_blob.row(y);

            for (int x = 0; x < w; ++x) {
                float sigmoid =
                    1.f / (1.f + expf(-in_ptr[x + offset]));

                out_ptr[x] = in_ptr[x] * sigmoid;
            }
        }
#else
        int size = offset;
        const float* in_ptr = bottom_blob;
        float* out_ptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; ++i)
        {
            float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
            out_ptr[i] = in_ptr[i] * sigmoid;
        }
#endif

        return 0;
    } // if (dims == 2 && positive_axis == 0)

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int out_w = w / 2;
        int out_h = h;

        top_blob.create(out_w, out_h, sizeof(float), opt.blob_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; ++y)
        {
            const float* in_ptr = bottom_blob.row(y);
            float* out_ptr = top_blob.row(y);

            for (int x = 0; x < out_w; ++x)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));
                out_ptr[x] = in_ptr[x] * sigmoid;
            }
        }

        return 0;
    } // if (dims == 2 && positive_axis == 1)

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w;
        int out_h = h;
        int out_c = c / 2;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        int offset = out_c * bottom_blob.cstep;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < out_c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);

            for (int i = 0; i < size; ++i)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
                out_ptr[i] = in_ptr[i] * sigmoid;
            }
        }
        return 0;
    } //   if (dims == 3 && positive_axis == 0) {

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w;
        int out_h = h / 2;
        int out_c = c;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        int offset = out_h * out_w;
        int size = offset;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);

            for (int i = 0; i < size; ++i)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
                out_ptr[i] = in_ptr[i] * sigmoid;
            }
        }
        return 0;
    } // if (dims == 3 && positive_axis == 1)

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w / 2;
        int out_h = h;
        int out_c = c;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < out_w; ++x)
                {
                    float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));
                    out_ptr[x] = in_ptr[x] * sigmoid;
                }
                in_ptr += w;
                out_ptr += out_w;
            }
        }
        return 0;
    } // if (dims == 3 && positive_axis == 2)

    return -100;
}